

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O1

libcaption_stauts_t sei_from_caption_frame(sei_t *sei,caption_frame_t *frame)

{
  double dVar1;
  sei_t *psVar2;
  uint16_t uVar3;
  uint16_t bna2;
  uint16_t uVar4;
  uint16_t uVar5;
  utf8_char_t *puVar6;
  int row;
  eia608_control_t col;
  eia608_style_t styl;
  int unl;
  cea708_t cea708;
  eia608_style_t local_e8;
  int local_e4;
  sei_t *local_e0;
  eia608_style_t local_d8;
  int local_d4;
  cea708_t local_d0;
  
  dVar1 = frame->timestamp;
  sei->head = (sei_message_t *)0x0;
  sei->tail = (sei_message_t *)0x0;
  sei->timestamp = dVar1;
  local_e0 = sei;
  cea708_init(&local_d0,frame->timestamp);
  row = 0;
  uVar3 = eia608_control_command(eia608_control_erase_non_displayed_memory,0);
  cea708_add_cc_data(&local_d0,1,cc_type_ntsc_cc_field_1,uVar3);
  uVar3 = eia608_control_command(eia608_control_resume_caption_loading,0);
  cea708_add_cc_data(&local_d0,1,cc_type_ntsc_cc_field_1,uVar3);
  do {
    col = 0;
    do {
      puVar6 = caption_frame_read_char(frame,row,col,&local_e8,&local_e4);
      if (*puVar6 != '\0') goto LAB_001067df;
      col = col + 1;
    } while (col != 0x20);
    col = 0x20;
LAB_001067df:
    if (col != 0x20) {
      if ((col == 0) && (local_e4 != 0 || local_e8 != eia608_style_white)) {
        uVar3 = eia608_row_style_pramble(row,0,local_e8,local_e4);
        sei_encode_eia608(local_e0,&local_d0,uVar3);
        local_d4 = local_e4;
        local_d8 = local_e8;
      }
      else {
        local_d4 = 0;
        uVar3 = eia608_row_column_pramble(row,col,0,0);
        sei_encode_eia608(local_e0,&local_d0,uVar3);
        local_d8 = eia608_style_white;
        if ((col & 3) != 0) {
          local_d4 = 0;
          uVar3 = eia608_control_command(col & 3 | eia608_tab_offset_0,0);
          sei_encode_eia608(local_e0,&local_d0,uVar3);
          local_d8 = eia608_style_white;
        }
      }
      uVar3 = 0;
      puVar6 = caption_frame_read_char(frame,row,col,(eia608_style_t *)0x0,(int *)0x0);
      if ((col < 0x20) && (*puVar6 != '\0')) {
        uVar5 = 0;
        do {
          bna2 = eia608_from_utf8_1(puVar6,0);
          if ((local_e4 != local_d4) || (local_e8 != local_d8)) {
            uVar3 = eia608_midrow_change(0,local_e8,local_e4);
            sei_encode_eia608(local_e0,&local_d0,uVar3);
            local_d4 = local_e4;
            local_d8 = local_e8;
          }
          uVar3 = uVar5;
          if (bna2 != 0) {
            uVar4 = bna2;
            if ((uVar5 & 0x6000) == 0) {
              if ((bna2 & 0x7660) == 0x1220) {
                uVar3 = eia608_from_utf8_1(" ",0);
                sei_encode_eia608(local_e0,&local_d0,uVar3);
              }
              else {
                uVar3 = bna2;
                if ((bna2 & 0x6000) != 0) goto LAB_001069d8;
              }
            }
            else {
              if ((bna2 & 0x6000) == 0) {
                if ((bna2 & 0x1660) != 0x1220) {
                  sei_encode_eia608(local_e0,&local_d0,uVar5);
                  uVar5 = 0;
                  goto LAB_001069c3;
                }
                uVar3 = eia608_from_utf8_1(" ",0);
                uVar3 = eia608_from_basicna(uVar5,uVar3);
                sei_encode_eia608(local_e0,&local_d0,uVar3);
              }
              else {
                uVar4 = eia608_from_basicna(uVar5,bna2);
              }
              uVar5 = 0;
            }
LAB_001069c3:
            uVar3 = uVar5;
            sei_encode_eia608(local_e0,&local_d0,uVar4);
          }
LAB_001069d8:
          if ((bna2 & 0x7770) == 0x1130) {
            uVar5 = eia608_control_command(eia608_control_resume_caption_loading,0);
            sei_encode_eia608(local_e0,&local_d0,uVar5);
          }
          puVar6 = caption_frame_read_char(frame,row,col + 1,&local_e8,&local_e4);
        } while ((col < 0x1f) && (col = col + 1, uVar5 = uVar3, *puVar6 != '\0'));
      }
      if (uVar3 != 0) {
        sei_encode_eia608(local_e0,&local_d0,uVar3);
      }
    }
    psVar2 = local_e0;
    row = row + 1;
    if (row == 0xf) {
      sei_encode_eia608(local_e0,&local_d0,0);
      psVar2->timestamp = frame->timestamp;
      return LIBCAPTION_OK;
    }
  } while( true );
}

Assistant:

libcaption_stauts_t sei_from_caption_frame(sei_t* sei, caption_frame_t* frame)
{
    int r, c;
    int unl, prev_unl;
    cea708_t cea708;
    const char* data;
    uint16_t prev_cc_data;
    eia608_style_t styl, prev_styl;

    sei_init(sei, frame->timestamp);
    cea708_init(&cea708, frame->timestamp); // set up a new popon frame
    cea708_add_cc_data(&cea708, 1, cc_type_ntsc_cc_field_1, eia608_control_command(eia608_control_erase_non_displayed_memory, DEFAULT_CHANNEL));
    cea708_add_cc_data(&cea708, 1, cc_type_ntsc_cc_field_1, eia608_control_command(eia608_control_resume_caption_loading, DEFAULT_CHANNEL));

    for (r = 0; r < SCREEN_ROWS; ++r) {
        prev_unl = 0, prev_styl = eia608_style_white;
        // Calculate preamble
        for (c = 0; c < SCREEN_COLS && 0 == *caption_frame_read_char(frame, r, c, &styl, &unl); ++c) {
        }

        // This row is blank
        if (SCREEN_COLS == c) {
            continue;
        }

        // Write preamble
        if (0 < c || (0 == unl && eia608_style_white == styl)) {
            int tab = c % 4;
            sei_encode_eia608(sei, &cea708, eia608_row_column_pramble(r, c, DEFAULT_CHANNEL, 0));
            if (tab) {
                sei_encode_eia608(sei, &cea708, eia608_tab(tab, DEFAULT_CHANNEL));
            }
        } else {
            sei_encode_eia608(sei, &cea708, eia608_row_style_pramble(r, DEFAULT_CHANNEL, styl, unl));
            prev_unl = unl, prev_styl = styl;
        }

        // Write the row
        for (prev_cc_data = 0, data = caption_frame_read_char(frame, r, c, 0, 0);
             (*data) && c < SCREEN_COLS; ++c, data = caption_frame_read_char(frame, r, c, &styl, &unl)) {
            uint16_t cc_data = eia608_from_utf8_1(data, DEFAULT_CHANNEL);

            if (unl != prev_unl || styl != prev_styl) {
                sei_encode_eia608(sei, &cea708, eia608_midrow_change(DEFAULT_CHANNEL, styl, unl));
                prev_unl = unl, prev_styl = styl;
            }

            if (!cc_data) {
                // We do't want to write bad data, so just ignore it.
            } else if (eia608_is_basicna(prev_cc_data)) {
                if (eia608_is_basicna(cc_data)) {
                    // previous and current chars are both basicna, combine them into current
                    sei_encode_eia608(sei, &cea708, eia608_from_basicna(prev_cc_data, cc_data));
                } else if (eia608_is_westeu(cc_data)) {
                    // extended charcters overwrite the previous charcter, so insert a dummy char thren write the extended char
                    sei_encode_eia608(sei, &cea708, eia608_from_basicna(prev_cc_data, eia608_from_utf8_1(EIA608_CHAR_SPACE, DEFAULT_CHANNEL)));
                    sei_encode_eia608(sei, &cea708, cc_data);
                } else {
                    // previous was basic na, but current isnt; write previous and current
                    sei_encode_eia608(sei, &cea708, prev_cc_data);
                    sei_encode_eia608(sei, &cea708, cc_data);
                }

                prev_cc_data = 0; // previous is handled, we can forget it now
            } else if (eia608_is_westeu(cc_data)) {
                // extended chars overwrite the previous chars, so insert a dummy char
                // TODO create a map of alternamt chars for eia608_is_westeu instead of using space
                sei_encode_eia608(sei, &cea708, eia608_from_utf8_1(EIA608_CHAR_SPACE, DEFAULT_CHANNEL));
                sei_encode_eia608(sei, &cea708, cc_data);
            } else if (eia608_is_basicna(cc_data)) {
                prev_cc_data = cc_data;
            } else {
                sei_encode_eia608(sei, &cea708, cc_data);
            }

            if (eia608_is_specialna(cc_data)) {
                // specialna are treated as control charcters. Duplicated control charcters are discarded
                // So we write a resume after a specialna as a noop to break repetition detection
                // TODO only do this if the same charcter is repeated
                sei_encode_eia608(sei, &cea708, eia608_control_command(eia608_control_resume_caption_loading, DEFAULT_CHANNEL));
            }
        }

        if (0 != prev_cc_data) {
            sei_encode_eia608(sei, &cea708, prev_cc_data);
        }
    }

    sei_encode_eia608(sei, &cea708, 0); // flush
    sei->timestamp = frame->timestamp; // assumes in order frames
    // sei_dump (sei);
    return LIBCAPTION_OK;
}